

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.c
# Opt level: O0

void usage(char *argv0,int exitval,char *errmsg)

{
  FILE *local_28;
  FILE *fp;
  char *errmsg_local;
  int exitval_local;
  char *argv0_local;
  
  local_28 = _stdout;
  if (exitval != 0) {
    local_28 = _stderr;
  }
  if (errmsg != (char *)0x0) {
    fprintf(local_28,"ERROR: %s\n\n",errmsg);
  }
  fprintf(local_28,"Usage: %s [-f|-F <arg>] [-n] [-s]\n",argv0);
  fprintf(local_28,
          "  -f - Format the output to stdout with JSON_C_TO_STRING_PRETTY (default is JSON_C_TO_STRING_SPACED)\n"
         );
  fprintf(local_28,
          "  -F - Format the output to stdout with <arg>, e.g. 0 for JSON_C_TO_STRING_PLAIN\n");
  fprintf(local_28,"  -n - No output\n");
  fprintf(local_28,"  -c - color\n");
  fprintf(local_28,"  -s - Parse in strict mode, flags:\n");
  fprintf(local_28,"       JSON_TOKENER_STRICT|JSON_TOKENER_ALLOW_TRAILING_CHARS\n");
  fprintf(local_28," Diagnostic information will be emitted to stderr\n");
  fprintf(local_28,"\nWARNING WARNING WARNING\n");
  fprintf(local_28,"This is a prototype, it may change or be removed at any time!\n");
  exit(exitval);
}

Assistant:

static void usage(const char *argv0, int exitval, const char *errmsg)
{
	FILE *fp = stdout;
	if (exitval != 0)
		fp = stderr;
	if (errmsg != NULL)
		fprintf(fp, "ERROR: %s\n\n", errmsg);
	fprintf(fp, "Usage: %s [-f|-F <arg>] [-n] [-s]\n", argv0);
	fprintf(fp, "  -f - Format the output to stdout with JSON_C_TO_STRING_PRETTY (default is JSON_C_TO_STRING_SPACED)\n");
	fprintf(fp, "  -F - Format the output to stdout with <arg>, e.g. 0 for JSON_C_TO_STRING_PLAIN\n");
	fprintf(fp, "  -n - No output\n");
	fprintf(fp, "  -c - color\n");
	fprintf(fp, "  -s - Parse in strict mode, flags:\n");
	fprintf(fp, "       JSON_TOKENER_STRICT|JSON_TOKENER_ALLOW_TRAILING_CHARS\n");
	fprintf(fp, " Diagnostic information will be emitted to stderr\n");

	fprintf(fp, "\nWARNING WARNING WARNING\n");
	fprintf(fp, "This is a prototype, it may change or be removed at any time!\n");
	exit(exitval);
}